

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_extract.cpp
# Opt level: O3

ScalarFunction * duckdb::MapExtractFun::GetFunction(void)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar3;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff2c;
  FunctionNullHandling in_stack_ffffffffffffff38;
  bind_lambda_function_t in_stack_ffffffffffffff40;
  scalar_function_t local_b8;
  LogicalType local_98;
  LogicalType local_80 [2];
  vector<duckdb::LogicalType,_true> local_50;
  LogicalType local_38;
  
  LogicalType::LogicalType(local_80,ANY);
  LogicalType::LogicalType(local_80 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_80;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_50,__l,
             (allocator_type *)&stack0xffffffffffffff47);
  LogicalType::LogicalType(&local_98,ANY);
  local_b8.super__Function_base._M_functor._8_8_ = 0;
  local_b8.super__Function_base._M_functor._M_unused._M_object = MapExtractListFunc;
  local_b8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_b8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_38,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_38;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff24;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff2c;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_50,&local_98,&local_b8,MapExtractBind<false>,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  LogicalType::~LogicalType(&local_38);
  if (local_b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b8.super__Function_base._M_manager)
              ((_Any_data *)&local_b8,(_Any_data *)&local_b8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_98);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_50);
  lVar3 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_80[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  LogicalType::LogicalType(local_80,ANY);
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.id_ = local_80[0].id_;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.physical_type_ =
       local_80[0].physical_type_;
  peVar1 = (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_80[0].type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_80[0].type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_80[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_80[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(local_80);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  return in_RDI;
}

Assistant:

ScalarFunction MapExtractFun::GetFunction() {
	ScalarFunction fun({LogicalType::ANY, LogicalType::ANY}, LogicalType::ANY, MapExtractListFunc,
	                   MapExtractBind<false>);
	fun.varargs = LogicalType::ANY;
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}